

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_init(void)

{
  double dVar1;
  double window;
  double y;
  double x;
  double dx;
  uint i;
  double local_38;
  double dVar2;
  double local_18;
  uint local_4;
  
  local_18 = 0.0;
  for (local_4 = 0; local_4 < 0x4001; local_4 = local_4 + 1) {
    dVar2 = cos((local_18 / 16.0) * 3.141592653589793);
    dVar2 = dVar2 * 0.5 + 0.40897;
    dVar1 = cos((local_18 / 16.0) * 6.283185307179586);
    if (16.0 <= ABS(local_18)) {
      local_38 = 0.0;
    }
    else {
      local_38 = sinc(dVar2);
    }
    sinc_lut[local_4] = (float)local_38;
    window_lut[local_4] = (float)(dVar2 + dVar1 * 0.09103);
    local_18 = local_18 + 0.0009765625;
  }
  local_18 = 0.0;
  for (local_4 = 0; local_4 < 0x400; local_4 = local_4 + 1) {
    cubic_lut[local_4 << 2] =
         (float)((local_18 * -0.5 * local_18 * local_18 + local_18 * local_18) - local_18 * 0.5);
    cubic_lut[local_4 * 4 + 1] =
         (float)((local_18 * 1.5 * local_18 * local_18 - local_18 * 2.5 * local_18) + 1.0);
    cubic_lut[local_4 * 4 + 2] =
         (float)(local_18 * -1.5 * local_18 * local_18 + local_18 * 2.0 * local_18 + local_18 * 0.5)
    ;
    cubic_lut[local_4 * 4 + 3] =
         (float)(local_18 * 0.5 * local_18 * local_18 - local_18 * 0.5 * local_18);
    local_18 = local_18 + 0.0009765625;
  }
  resampler_has_sse = query_cpu_feature_sse();
  return;
}

Assistant:

void resampler_init(void)
{
    unsigned i;
    double dx = (float)(SINC_WIDTH) / SINC_SAMPLES, x = 0.0;
    for (i = 0; i < SINC_SAMPLES + 1; ++i, x += dx)
    {
        double y = x / SINC_WIDTH;
#if 0
        // Blackman
        float window = 0.42659 - 0.49656 * cos(M_PI + M_PI * y) + 0.076849 * cos(2.0 * M_PI * y);
#elif 1
        // Nuttal 3 term
        double window = 0.40897 + 0.5 * cos(M_PI * y) + 0.09103 * cos(2.0 * M_PI * y);
#elif 0
        // C.R.Helmrich's 2 term window
        float window = 0.79445 * cos(0.5 * M_PI * y) + 0.20555 * cos(1.5 * M_PI * y);
#elif 0
        // Lanczos
        float window = sinc(y);
#endif
        sinc_lut[i] = (float)(fabs(x) < SINC_WIDTH ? sinc(x) : 0.0);
        window_lut[i] = (float)window;
    }
    dx = 1.0 / RESAMPLER_RESOLUTION;
    x = 0.0;
    for (i = 0; i < RESAMPLER_RESOLUTION; ++i, x += dx)
    {
        cubic_lut[i*4]   = (float)(-0.5 * x * x * x +       x * x - 0.5 * x);
        cubic_lut[i*4+1] = (float)( 1.5 * x * x * x - 2.5 * x * x           + 1.0);
        cubic_lut[i*4+2] = (float)(-1.5 * x * x * x + 2.0 * x * x + 0.5 * x);
        cubic_lut[i*4+3] = (float)( 0.5 * x * x * x - 0.5 * x * x);
    }
#ifdef RESAMPLER_SSE
    resampler_has_sse = query_cpu_feature_sse();
#endif
}